

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_byte_for_non_strings.cpp
# Opt level: O3

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  undefined8 uStack_28;
  
  lVar2 = 3;
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT17(0x41,(undefined7)uStack_28);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return 0;
}

Assistant:

int main() {
  std::array<std::byte, 3> bytes = {
    std::byte{ 0x41 },
    std::byte{ 0x41 },
    std::byte{ 0x41 }
  };
  for (auto const & byte : bytes) {
    std::cout << static_cast<unsigned char>(byte) << "\n";
  }
}